

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::Interpreter::BaConnModeToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,uint32_t aConnMode)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "disallowed";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "PSKc";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "PSKd";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "vendor";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "X.509";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "reserved";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::BaConnModeToString(uint32_t aConnMode)
{
    switch (aConnMode)
    {
    case 0:
        return "disallowed";
    case 1:
        return "PSKc";
    case 2:
        return "PSKd";
    case 3:
        return "vendor";
    case 4:
        return "X.509";
    default:
        return "reserved";
    }
}